

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

uint64_t aom_mse_16xh_16bit_avx2(uint8_t *dst,int dstride,uint16_t *src,int w,int h)

{
  int in_ECX;
  int in_stack_000001c0;
  int in_stack_000001c4;
  uint16_t *in_stack_000001c8;
  int in_stack_000001d4;
  uint8_t *in_stack_000001d8;
  int in_stack_00000300;
  int in_stack_00000304;
  uint16_t *in_stack_00000308;
  int in_stack_00000314;
  uint8_t *in_stack_00000318;
  undefined8 local_8;
  
  if (in_ECX == 4) {
    local_8 = mse_4xh_quad_16bit_avx2
                        (in_stack_00000318,in_stack_00000314,in_stack_00000308,in_stack_00000304,
                         in_stack_00000300);
  }
  else if (in_ECX == 8) {
    local_8 = mse_8xh_dual_16bit_avx2
                        (in_stack_000001d8,in_stack_000001d4,in_stack_000001c8,in_stack_000001c4,
                         in_stack_000001c0);
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t aom_mse_16xh_16bit_avx2(uint8_t *dst, int dstride, uint16_t *src,
                                 int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must be satisfied");
  switch (w) {
    case 4: return mse_4xh_quad_16bit_avx2(dst, dstride, src, w * h, h);
    case 8: return mse_8xh_dual_16bit_avx2(dst, dstride, src, w * h, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}